

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll-multiple-handles.c
# Opt level: O0

int run_test_poll_multiple_handles(void)

{
  int iVar1;
  int iVar2;
  uv_loop_t *puVar3;
  int64_t eval_b_11;
  int64_t eval_a_11;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_poll_t second_poll_handle;
  uv_poll_t first_poll_handle;
  uv_os_sock_t sock;
  
  iVar1 = socket(2,1,0);
  if (iVar1 == -1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-multiple-handles.c"
            ,0x3e,"sock","!=","-1",0xffffffffffffffff,"!=",0xffffffffffffffff);
    abort();
  }
  puVar3 = uv_default_loop();
  iVar2 = uv_poll_init(puVar3,(uv_poll_t *)&second_poll_handle.io_watcher.fd,iVar1);
  if ((long)iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-multiple-handles.c"
            ,0x40,"uv_poll_init(uv_default_loop(), &first_poll_handle, sock)","==","0",(long)iVar2,
            "==",0);
    abort();
  }
  puVar3 = uv_default_loop();
  iVar1 = uv_poll_init(puVar3,(uv_poll_t *)&eval_a,iVar1);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-multiple-handles.c"
            ,0x41,"uv_poll_init(uv_default_loop(), &second_poll_handle, sock)","==","0",(long)iVar1,
            "==",0);
    abort();
  }
  iVar1 = uv_poll_start((uv_poll_t *)&second_poll_handle.io_watcher.fd,1,poll_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-multiple-handles.c"
            ,0x43,"uv_poll_start(&first_poll_handle, UV_READABLE, poll_cb)","==","0",(long)iVar1,
            "==",0);
    abort();
  }
  iVar1 = uv_poll_start((uv_poll_t *)&eval_a,1,poll_cb);
  if ((long)iVar1 != -0x11) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-multiple-handles.c"
            ,0x4d,"uv_poll_start(&second_poll_handle, UV_READABLE, poll_cb)","==","UV_EEXIST",
            (long)iVar1,"==",0xffffffffffffffef);
    abort();
  }
  iVar1 = uv_poll_stop((uv_poll_t *)&second_poll_handle.io_watcher.fd);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-multiple-handles.c"
            ,0x51,"uv_poll_stop(&first_poll_handle)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_poll_start((uv_poll_t *)&eval_a,1,poll_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-multiple-handles.c"
            ,0x52,"uv_poll_start(&second_poll_handle, UV_READABLE, poll_cb)","==","0",(long)iVar1,
            "==",0);
    abort();
  }
  uv_close((uv_handle_t *)&second_poll_handle.io_watcher.fd,close_cb);
  uv_unref((uv_handle_t *)&eval_a);
  puVar3 = uv_default_loop();
  iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-multiple-handles.c"
            ,0x58,"uv_run(uv_default_loop(), UV_RUN_DEFAULT)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)close_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-multiple-handles.c"
            ,0x59,"1","==","close_cb_called",1,"==",(long)close_cb_called);
    abort();
  }
  uv_ref((uv_handle_t *)&eval_a);
  iVar1 = uv_is_active((uv_handle_t *)&eval_a);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-multiple-handles.c"
            ,0x5c,"uv_is_active((uv_handle_t*) &second_poll_handle)");
    abort();
  }
  uv_close((uv_handle_t *)&eval_a,close_cb);
  puVar3 = uv_default_loop();
  iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-multiple-handles.c"
            ,0x5f,"uv_run(uv_default_loop(), UV_RUN_DEFAULT)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)close_cb_called != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-multiple-handles.c"
            ,0x60,"2","==","close_cb_called",2,"==",(long)close_cb_called);
    abort();
  }
  puVar3 = uv_default_loop();
  close_loop(puVar3);
  puVar3 = uv_default_loop();
  iVar1 = uv_loop_close(puVar3);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-multiple-handles.c"
            ,0x62,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(poll_multiple_handles) {
  uv_os_sock_t sock;
  uv_poll_t first_poll_handle, second_poll_handle;

#ifdef _WIN32
  {
    struct WSAData wsa_data;
    int r = WSAStartup(MAKEWORD(2, 2), &wsa_data);
    ASSERT_OK(r);
  }
#endif

  sock = socket(AF_INET, SOCK_STREAM, 0);
#ifdef _WIN32
  ASSERT_NE(sock, INVALID_SOCKET);
#else
  ASSERT_NE(sock, -1);
#endif
  ASSERT_OK(uv_poll_init(uv_default_loop(), &first_poll_handle, sock));
  ASSERT_OK(uv_poll_init(uv_default_loop(), &second_poll_handle, sock));

  ASSERT_OK(uv_poll_start(&first_poll_handle, UV_READABLE, poll_cb));

  /* We may not start polling while another polling handle is active
   * on that fd.
   */
#ifndef _WIN32
  /* We do not track handles in an O(1) lookupable way on Windows,
   * so not checking that here.
   */
  ASSERT_EQ(uv_poll_start(&second_poll_handle, UV_READABLE, poll_cb),
            UV_EEXIST);
#endif

  /* After stopping the other polling handle, we now should be able to poll */
  ASSERT_OK(uv_poll_stop(&first_poll_handle));
  ASSERT_OK(uv_poll_start(&second_poll_handle, UV_READABLE, poll_cb));

  /* Closing an already stopped polling handle is safe in any case */
  uv_close((uv_handle_t*) &first_poll_handle, close_cb);

  uv_unref((uv_handle_t*) &second_poll_handle);
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT_EQ(1, close_cb_called);
  uv_ref((uv_handle_t*) &second_poll_handle);

  ASSERT(uv_is_active((uv_handle_t*) &second_poll_handle));
  uv_close((uv_handle_t*) &second_poll_handle, close_cb);

  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT_EQ(2, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}